

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  int path2;
  bool bVar1;
  ushort uVar2;
  MessageOptions *options;
  uint *puVar3;
  EnumDescriptorProto *enum_type;
  OneofDescriptorProto *oneof_decl;
  FieldDescriptorProto *field;
  DescriptorProto *message_00;
  uint uVar4;
  size_type sVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  LocationRecorder location;
  SymbolVisibility visibility;
  LocationRecorder local_50;
  SymbolVisibility local_34;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar1) {
    return true;
  }
  local_34 = VISIBILITY_UNSET;
  puVar3 = (uint *)(this->input_->current_).text._M_dataplus._M_p;
  sVar5 = (this->input_->current_).text._M_string_length;
  if (sVar5 == 5) {
    uVar4 = *puVar3 ^ 0x61636f6c;
    uVar2 = (byte)puVar3[1] ^ 0x6c;
LAB_001ff77d:
    if (uVar2 == 0 && uVar4 == 0) {
      bVar1 = ParseVisibility(this,containing_file,&local_34);
      if (!bVar1) {
        return false;
      }
      puVar3 = (uint *)(this->input_->current_).text._M_dataplus._M_p;
      sVar5 = (this->input_->current_).text._M_string_length;
      goto LAB_001ff851;
    }
  }
  else {
    if (sVar5 == 6) {
      uVar4 = *puVar3 ^ 0x6f707865;
      uVar2 = (ushort)puVar3[1] ^ 0x7472;
      goto LAB_001ff77d;
    }
LAB_001ff851:
    switch(sVar5) {
    case 4:
      if (*puVar3 == 0x6d756e65) {
        LocationRecorder::LocationRecorder
                  (&local_50,message_location,4,*(int *)((long)&message->field_0 + 0x40));
        enum_type = (EnumDescriptorProto *)
                    internal::RepeatedPtrFieldBase::AddMessageLite
                              (&(message->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                               Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
        bVar1 = ParseEnumDefinition(this,enum_type,&local_34,&local_50,containing_file);
        goto LAB_001ffa58;
      }
      break;
    case 7:
      if (*(int *)((long)puVar3 + 3) == 0x65676173 && *puVar3 == 0x7373656d) {
        LocationRecorder::LocationRecorder
                  (&local_50,message_location,3,*(int *)((long)&message->field_0 + 0x28));
        message_00 = (DescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
        bVar1 = ParseMessageDefinition(this,message_00,&local_34,&local_50,containing_file);
        goto LAB_001ffa58;
      }
      break;
    case 8:
      if (*(long *)puVar3 == 0x6465767265736572) {
        bVar1 = ParseReserved(this,message,message_location);
        return bVar1;
      }
      break;
    case 10:
      if ((short)puVar3[2] == 0x736e && *(long *)puVar3 == 0x6f69736e65747865) {
        LocationRecorder::Init(&local_50,message_location,message_location->source_code_info_);
        RepeatedField<int>::Add(&((local_50.location_)->field_0)._impl_.path_,5);
        bVar1 = ParseExtensions(this,message,&local_50,containing_file);
        goto LAB_001ffa58;
      }
    }
  }
  text_00._M_str = "extend";
  text_00._M_len = 6;
  bVar1 = LookingAt(this,text_00);
  if (bVar1) {
    LocationRecorder::LocationRecorder(&local_50,message_location,6);
    bVar1 = ParseExtend(this,&(message->field_0)._impl_.extension_,
                        &(message->field_0)._impl_.nested_type_,message_location,3,&local_50,
                        containing_file);
  }
  else {
    text_01._M_str = "option";
    text_01._M_len = 6;
    bVar1 = LookingAt(this,text_01);
    if (bVar1) {
      LocationRecorder::LocationRecorder(&local_50,message_location,7);
      options = DescriptorProto::mutable_options(message);
      bVar1 = ParseOption(this,&options->super_Message,&local_50,containing_file,OPTION_STATEMENT);
    }
    else {
      text_02._M_str = "oneof";
      text_02._M_len = 5;
      bVar1 = LookingAt(this,text_02);
      if (bVar1) {
        path2 = *(int *)((long)&message->field_0 + 0x88);
        LocationRecorder::LocationRecorder(&local_50,message_location,8,path2);
        oneof_decl = (OneofDescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
        bVar1 = ParseOneof(this,oneof_decl,message,path2,&local_50,message_location,containing_file)
        ;
      }
      else {
        LocationRecorder::LocationRecorder
                  (&local_50,message_location,2,*(int *)((long)&message->field_0 + 0x10));
        field = (FieldDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(message->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
        bVar1 = ParseMessageField(this,field,&(message->field_0)._impl_.nested_type_,
                                  message_location,3,&local_50,containing_file);
      }
    }
  }
LAB_001ffa58:
  LocationRecorder::~LocationRecorder(&local_50);
  return bVar1;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  }

  SymbolVisibility visibility = SymbolVisibility::VISIBILITY_UNSET;
  if (LookingAt("export") || LookingAt("local")) {
    DO(ParseVisibility(containing_file, &visibility));
  }

  if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), visibility,
                                  location, containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), visibility, location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}